

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall NavierStokesBase::init_additional_state_types(NavierStokesBase *this)

{
  bool bVar1;
  Print *x;
  int dummy_Dsdt_Type;
  int _Dsdt;
  int dummy_Divu_Type;
  int _Divu;
  int have_temp;
  int dummy_State_Type;
  char (*in_stack_fffffffffffff568) [65];
  Print *in_stack_fffffffffffff570;
  Print *this_00;
  int *in_stack_fffffffffffff578;
  int *in_stack_fffffffffffff580;
  char *msg;
  string *in_stack_fffffffffffff588;
  ostream *in_stack_fffffffffffff598;
  Print *in_stack_fffffffffffff5a0;
  bool local_a52;
  bool local_a26;
  Print *this_01;
  Print local_a00;
  char local_878 [791];
  undefined1 local_561;
  ostream local_560 [399];
  allocator local_3d1;
  string local_3d0 [32];
  int local_3b0;
  int local_3ac;
  undefined1 local_219;
  undefined1 local_89 [37];
  int local_64;
  int local_60;
  allocator local_49;
  string local_48 [32];
  uint local_28;
  int local_24;
  char *local_18;
  char *local_10;
  char *local_8;
  
  additional_state_types_initialized = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"temp",&local_49);
  bVar1 = amrex::AmrLevel::isStateVariable
                    (in_stack_fffffffffffff588,in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_28 = (uint)(bVar1 && local_24 == 0);
  local_60 = -1;
  have_divu = 0;
  this_01 = (Print *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_89 + 1),"divu",(allocator *)this_01);
  bVar1 = amrex::AmrLevel::isStateVariable
                    (in_stack_fffffffffffff588,in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  have_divu = (int)bVar1;
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  local_a26 = have_divu != 0 && local_64 == Divu_Type;
  have_divu = (int)local_a26;
  if (verbose != 0) {
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
    amrex::Print::operator<<(in_stack_fffffffffffff570,(char (*) [62])in_stack_fffffffffffff568);
    amrex::Print::operator<<(in_stack_fffffffffffff570,(int *)in_stack_fffffffffffff568);
    local_219 = 10;
    amrex::Print::operator<<(in_stack_fffffffffffff570,*in_stack_fffffffffffff568);
    amrex::Print::~Print(this_01);
  }
  if ((have_divu != 0) && (local_60 != 0)) {
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
    amrex::Print::operator<<(in_stack_fffffffffffff570,(char (*) [52])in_stack_fffffffffffff568);
    amrex::Print::~Print(this_01);
    local_8 = "NavierStokesBase::init_additional_state_types()";
    amrex::Abort_host((char *)in_stack_fffffffffffff580);
  }
  local_3ac = -1;
  have_dsdt = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"dsdt",&local_3d1);
  bVar1 = amrex::AmrLevel::isStateVariable
                    (in_stack_fffffffffffff588,in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  have_dsdt = (int)bVar1;
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  local_a52 = have_dsdt != 0 && local_3b0 == Dsdt_Type;
  have_dsdt = (int)local_a52;
  if (verbose != 0) {
    amrex::OutStream();
    in_stack_fffffffffffff598 = local_560;
    amrex::Print::Print(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
    in_stack_fffffffffffff5a0 =
         amrex::Print::operator<<
                   (in_stack_fffffffffffff570,(char (*) [62])in_stack_fffffffffffff568);
    amrex::Print::operator<<(in_stack_fffffffffffff570,(int *)in_stack_fffffffffffff568);
    local_561 = 10;
    amrex::Print::operator<<(in_stack_fffffffffffff570,*in_stack_fffffffffffff568);
    amrex::Print::~Print(this_01);
  }
  if ((have_dsdt != 0) && (local_3ac != 0)) {
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
    amrex::Print::operator<<(in_stack_fffffffffffff570,(char (*) [52])in_stack_fffffffffffff568);
    amrex::Print::~Print(this_01);
    local_10 = "NavierStokesBase::init_additional_state_types()";
    amrex::Abort_host((char *)in_stack_fffffffffffff580);
  }
  if ((have_dsdt != 0) && (have_divu == 0)) {
    amrex::OutStream();
    msg = local_878;
    amrex::Print::Print(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
    amrex::Print::operator<<(in_stack_fffffffffffff570,(char (*) [38])in_stack_fffffffffffff568);
    amrex::Print::~Print(this_01);
    local_18 = "NavierStokesBase::init_additional_state_types()";
    amrex::Abort_host(msg);
  }
  num_state_type = amrex::DescriptorList::size((DescriptorList *)0x5137ce);
  if ((verbose != 0) && (bVar1 = amrex::ParallelDescriptor::IOProcessor(), bVar1)) {
    amrex::OutStream();
    this_00 = &local_a00;
    amrex::Print::Print(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
    amrex::Print::operator<<(this_00,in_stack_fffffffffffff568);
    x = amrex::Print::operator<<(this_00,(int *)in_stack_fffffffffffff568);
    amrex::Print::operator<<(this_00,(char *)x);
    amrex::Print::~Print(this_01);
  }
  return;
}

Assistant:

void
NavierStokesBase::init_additional_state_types ()
{
    additional_state_types_initialized = 1;
    //
    // Set "Temp" from user's variable setup.
    //
    int dummy_State_Type;
    int have_temp = isStateVariable("temp", dummy_State_Type, Temp);
    have_temp &= (dummy_State_Type == State_Type);
    AMREX_ASSERT((do_temp && have_temp)  ||  (!do_temp && !have_temp));

    int _Divu = -1;
    int dummy_Divu_Type;
    have_divu = 0;
    have_divu = isStateVariable("divu", dummy_Divu_Type, _Divu);
    have_divu = have_divu && dummy_Divu_Type == Divu_Type;
    if (verbose)
    {
        amrex::Print() << "NavierStokesBase::init_additional_state_types()::have_divu = "
                  << have_divu << '\n';
    }
    if (have_divu && _Divu!=Divu)
    {
        amrex::Print() << "divu must be 0-th Divu_Type component in the state\n";
        amrex::Abort("NavierStokesBase::init_additional_state_types()");
    }

    int _Dsdt = -1;
    int dummy_Dsdt_Type;
    have_dsdt = 0;
    have_dsdt = isStateVariable("dsdt", dummy_Dsdt_Type, _Dsdt);
    have_dsdt = have_dsdt && dummy_Dsdt_Type==Dsdt_Type;
    if (verbose)
    {
        amrex::Print() << "NavierStokesBase::init_additional_state_types()::have_dsdt = "
                       << have_dsdt << '\n';
    }
    if (have_dsdt && _Dsdt!=Dsdt)
    {
        amrex::Print() << "dsdt must be 0-th Dsdt_Type component in the state\n";
        amrex::Abort("NavierStokesBase::init_additional_state_types()");
    }
    if (have_dsdt && !have_divu)
    {
        amrex::Print() << "Must have divu in order to have dsdt\n";
        amrex::Abort("NavierStokesBase::init_additional_state_types()");
    }

    num_state_type = desc_lst.size();
    if (verbose && ParallelDescriptor::IOProcessor())
    {
        amrex::Print() << "NavierStokesBase::init_additional_state_types: num_state_type = "
                       << num_state_type << '\n';
    }
}